

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

ValueType __thiscall ValueType::Merge(ValueType *this,Var var)

{
  ValueType valueType;
  code *pcVar1;
  Type bits;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  RecyclableObject *this_00;
  bool bVar4;
  RecyclableObject *recyclableObject;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_01;
  undefined8 local_28;
  ValueType merged_1;
  ValueType merged;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    recyclableObject = (RecyclableObject *)0x44d;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x44d,"(var)","var");
    if (!bVar4) {
LAB_00b136ac:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
LAB_00b13558:
    this_00 = Js::UnsafeVarTo<Js::RecyclableObject>(var);
    aVar2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         FromObject((ValueType *)this_00,recyclableObject);
    Verify(*(ValueType *)&(this->field_0).field_0);
    Verify((ValueType)aVar2.field_0);
    if ((this->field_0).bits == aVar2.bits) {
      return (ValueType)
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)aVar2;
    }
    bits = (this->field_0).bits | aVar2.bits;
    this_01 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)&local_28 + 6);
LAB_00b13592:
    ValueType((ValueType *)&this_01->field_0,bits);
    valueType.field_0 =
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_01->field_0;
    if (((ushort)valueType.field_0 & 0x10) == 0) {
      Verify(valueType);
      return (ValueType)
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             valueType.field_0;
    }
  }
  else {
    bVar4 = ((ulong)var & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)var & 0xffff000000000000) != 0x1000000000000;
    recyclableObject =
         (RecyclableObject *)CONCAT71((int7)(((ulong)var & 0x1ffff00000000) >> 8),bVar4);
    local_28 = in_RAX;
    if (bVar4) {
      if (((ulong)var & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)var >> 0x32 == 0) goto LAB_00b13558;
        aVar2.bits = Float|CanBeTaggedValue;
        if (((this->field_0).bits & ~CanBeTaggedValue) == Likely ||
            ((this->field_0).bits &
            ~(Number|IntIsLikelyUntagged|IntCanBeUntagged|CanBeTaggedValue|Likely)) == Int) {
          bVar4 = Js::JavascriptNumber::IsInt32_NoChecks(var);
          if (bVar4) {
            ValueType((ValueType *)&local_28,
                      IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
            Verify((ValueType)local_28._0_2_);
            aVar2 = local_28._0_2_;
          }
        }
        Verify(*(ValueType *)&(this->field_0).field_0);
        Verify((ValueType)aVar2.field_0);
        if ((this->field_0).bits == aVar2.bits) {
          return (ValueType)aVar2.field_0;
        }
        bits = (this->field_0).bits | aVar2.bits;
        this_01 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)&local_28 + 4);
        goto LAB_00b13592;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00b136ac;
      *puVar3 = 0;
    }
    Verify(*(ValueType *)&(this->field_0).field_0);
    if ((this->field_0).bits == (Int|CanBeTaggedValue)) {
      return (ValueType)(anon_union_2_4_ea848c7b_for_ValueType_13)0x28;
    }
    ValueType((ValueType *)((long)&local_28 + 2),(this->field_0).bits | (Int|CanBeTaggedValue));
    if ((local_28._2_2_ & Object) == 0) {
      Verify((ValueType)local_28._2_2_);
      return (ValueType)local_28._2_2_;
    }
    aVar2.bits = Int|CanBeTaggedValue;
  }
  aVar2.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       MergeWithObject(this,aVar2.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar2.field_0;
}

Assistant:

ValueType ValueType::Merge(const Js::Var var) const
{
    using namespace Js;
    Assert(var);

    if(TaggedInt::Is(var))
        return Merge(GetTaggedInt());
    if(JavascriptNumber::Is_NoTaggedIntCheck(var))
    {
        return
            Merge(
                (IsUninitialized() || IsLikelyInt()) && JavascriptNumber::IsInt32_NoChecks(var)
                    ? GetInt(false)
                    : ValueType::Float);
    }
    return Merge(FromObject(UnsafeVarTo<RecyclableObject>(var)));
}